

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_listen2cluster(void *ignore)

{
  uint uVar1;
  int *piVar2;
  code *local_48;
  undefined8 local_40;
  code *local_38;
  code *local_30;
  code *local_28;
  undefined8 local_20;
  fio_protocol_s *local_18;
  fio_protocol_s *p;
  void *ignore_local;
  
  p = (fio_protocol_s *)ignore;
  fio_lock(&cluster_data.lock);
  cluster_data.uuid = fio_socket(cluster_data.name,(char *)0x0,'\x01');
  fio_unlock(&cluster_data.lock);
  if (cluster_data.uuid < 0) {
    if (0 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("FATAL: (facil.io cluster) failed to open cluster socket.");
    }
    perror("             check file permissions. errno:");
    piVar2 = __errno_location();
    exit(*piVar2);
  }
  local_18 = (fio_protocol_s *)malloc(0x30);
  if (local_18 == (fio_protocol_s *)0x0) {
    if (0 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:6226"
                    );
    }
    kill(0,2);
    piVar2 = __errno_location();
    exit(*piVar2);
  }
  local_48 = fio_cluster_listen_accept;
  local_40 = 0;
  local_38 = mock_on_shutdown_eternal;
  local_30 = fio_cluster_listen_on_close;
  local_28 = mock_ping_eternal;
  local_20 = 0;
  memcpy(local_18,&local_48,0x30);
  if (4 < FIO_LOG_LEVEL) {
    uVar1 = getpid();
    FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:6234): (%d) Listening to cluster: %s"
                   ,(ulong)uVar1,0x175381);
  }
  fio_attach(cluster_data.uuid,local_18);
  return;
}

Assistant:

static void fio_listen2cluster(void *ignore) {
  /* this is called for each `fork`, but we only need this to run once. */
  fio_lock(&cluster_data.lock);
  cluster_data.uuid = fio_socket(cluster_data.name, NULL, 1);
  fio_unlock(&cluster_data.lock);
  if (cluster_data.uuid < 0) {
    FIO_LOG_FATAL("(facil.io cluster) failed to open cluster socket.");
    perror("             check file permissions. errno:");
    exit(errno);
  }
  fio_protocol_s *p = malloc(sizeof(*p));
  FIO_ASSERT_ALLOC(p);
  *p = (fio_protocol_s){
      .on_data = fio_cluster_listen_accept,
      .on_shutdown = mock_on_shutdown_eternal,
      .ping = mock_ping_eternal,
      .on_close = fio_cluster_listen_on_close,
  };
  FIO_LOG_DEBUG("(%d) Listening to cluster: %s", (int)getpid(),
                cluster_data.name);
  fio_attach(cluster_data.uuid, p);
  (void)ignore;
}